

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

Action<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> * __thiscall
testing::internal::
OnCallSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)>::GetAction
          (OnCallSpec<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> *this)

{
  int iVar1;
  allocator local_39;
  string local_38;
  
  iVar1 = *(int *)(this + 0xc);
  std::__cxx11::string::string
            ((string *)&local_38,".WillByDefault() must appear exactly once in an ON_CALL().",
             &local_39);
  UntypedOnCallSpecBase::AssertSpecProperty((UntypedOnCallSpecBase *)this,iVar1 == 2,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return (Action<void_(const_std::vector<char,_std::allocator<char>_>_&,_unsigned_long)> *)
         (this + 0x58);
}

Assistant:

const Action<F>& GetAction() const {
    AssertSpecProperty(last_clause_ == kWillByDefault,
                       ".WillByDefault() must appear exactly "
                       "once in an ON_CALL().");
    return action_;
  }